

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void google::protobuf::json_internal::ParseProto3Type::
     SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
               (Field f,Msg *msg,int x)

{
  int iVar1;
  Field *pFVar2;
  
  RecordAsSeen(f,msg);
  pFVar2 = f->raw_;
  iVar1 = (pFVar2->field_0)._impl_.kind_;
  if (iVar1 != 5) {
    if (iVar1 == 0xf) {
      io::CodedOutputStream::WriteVarint32(&msg->stream_,(pFVar2->field_0)._impl_.number_ * 8 + 5);
      io::CodedOutputStream::WriteLittleEndian32(&msg->stream_,x);
      return;
    }
    if (iVar1 != 0x11) {
      return;
    }
    x = x >> 0x1f ^ x * 2;
  }
  io::CodedOutputStream::WriteVarint32(&msg->stream_,(pFVar2->field_0)._impl_.number_ << 3);
  io::CodedOutputStream::WriteVarint32(&msg->stream_,x);
  return;
}

Assistant:

static void SetInt(Field f, Msg& msg, Int x) {
    RecordAsSeen(f, msg);
    switch (f->proto().kind()) {
      case zigzag:
        // Regardless of the integer type, ZigZag64 will do the right thing,
        // because ZigZag is not dependent on the width of the integer: it is
        // always `2 * abs(n) + (n < 0)`.
        x = static_cast<Int>(
            internal::WireFormatLite::ZigZagEncode64(static_cast<int64_t>(x)));
        ABSL_FALLTHROUGH_INTENDED;
      case varint:
        msg.stream_.WriteTag(f->proto().number() << 3 |
                             WireFormatLite::WIRETYPE_VARINT);
        if (sizeof(Int) == 4) {
          msg.stream_.WriteVarint32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteVarint64(static_cast<uint64_t>(x));
        }
        break;
      case fixed: {
        if (sizeof(Int) == 4) {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED32);
          msg.stream_.WriteLittleEndian32(static_cast<uint32_t>(x));
        } else {
          msg.stream_.WriteTag(f->proto().number() << 3 |
                               WireFormatLite::WIRETYPE_FIXED64);
          msg.stream_.WriteLittleEndian64(static_cast<uint64_t>(x));
        }
        break;
      }
      default: {  // Unreachable.
      }
    }
  }